

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roialign.cpp
# Opt level: O2

int __thiscall ncnn::ROIAlign::load_param(ROIAlign *this,ParamDict *pd)

{
  int iVar1;
  float fVar2;
  
  iVar1 = ParamDict::get(pd,0,0);
  this->pooled_width = iVar1;
  iVar1 = ParamDict::get(pd,1,0);
  this->pooled_height = iVar1;
  fVar2 = ParamDict::get(pd,2,1.0);
  this->spatial_scale = fVar2;
  iVar1 = ParamDict::get(pd,3,0);
  this->sampling_ratio = iVar1;
  iVar1 = ParamDict::get(pd,4,0);
  this->aligned = iVar1 != 0;
  iVar1 = ParamDict::get(pd,5,0);
  this->version = iVar1;
  return 0;
}

Assistant:

int ROIAlign::load_param(const ParamDict& pd)
{
    pooled_width = pd.get(0, 0);
    pooled_height = pd.get(1, 0);
    spatial_scale = pd.get(2, 1.f);
    sampling_ratio = pd.get(3, 0);
    aligned = pd.get(4, false);
    version = pd.get(5, 0);
    /*
     * version 0:
     *  the original version of ROIAlign in ncnn
     * version 1:
     *  the version in detectron2
     */
    assert(version >= 0 && version <= 1);

    return 0;
}